

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O1

void __thiscall
glcts::InterfaceMatchingCase::logProgramInfoLog
          (InterfaceMatchingCase *this,Functions *gl,GLuint program)

{
  TestLog *pTVar1;
  pointer pcVar2;
  GLenum err;
  size_t sVar3;
  vector<char,_std::allocator<char>_> infoLogBuf;
  GLsizei length;
  GLint value;
  vector<char,_std::allocator<char>_> local_1c8;
  GLsizei local_1b0;
  GLint local_1ac;
  undefined1 local_1a8 [8];
  _func_int **local_1a0;
  ios_base local_130 [264];
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1ac = 0;
  local_1b0 = 0;
  (*gl->getProgramiv)(program,0x8b84,&local_1ac);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_1c8,(long)(local_1ac + 1),(allocator_type *)local_1a8);
  (*gl->getProgramInfoLog)
            (program,0,&local_1b0,
             local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
  err = (*gl->getError)();
  glu::checkError(err,"GetProgramInfoLog failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cSeparateShaderObjsTests.cpp"
                  ,0xa3f);
  local_1a8 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,"Program Log:\n",0xd);
  pcVar2 = local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a0 + (int)local_1a0[-3]);
  }
  else {
    sVar3 = strlen(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,pcVar2,sVar3);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  std::ios_base::~ios_base(local_130);
  if (local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void logProgramInfoLog(const glw::Functions& gl, glw::GLuint program)
	{
		TestLog&	 log	 = m_testCtx.getLog();
		glw::GLint   value   = 0;
		glw::GLsizei bufSize = 0;
		glw::GLsizei length  = 0;

		gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &value);
		std::vector<char> infoLogBuf(value + 1);

		gl.getProgramInfoLog(program, bufSize, &length, &infoLogBuf[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramInfoLog failed");

		log << TestLog::Message << "Program Log:\n" << &infoLogBuf[0] << TestLog::EndMessage;
	}